

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_pixelformat.cpp
# Opt level: O2

void __thiscall Prog::draw_sample(Prog *this)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ALLEGRO_BITMAP *bmp;
  ALLEGRO_BITMAP *bmp_00;
  char *__s;
  undefined8 uVar8;
  string *this_00;
  double dVar9;
  allocator<char> local_1a1;
  double local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string s;
  
  iVar4 = List::get_cur_value(&this->source_list);
  iVar5 = List::get_cur_value(&this->dest_list);
  bVar2 = Button::get_pushed(&(this->use_memory_button).super_Button);
  bVar3 = Button::get_pushed(&(this->enable_timing_button).super_Button);
  local_1a0 = (double)CONCAT71(local_1a0._1_7_,bVar3);
  uVar8 = 0x400;
  if (bVar2) {
    uVar8 = 1;
  }
  al_set_new_bitmap_flags(uVar8);
  uVar1 = formats[iVar4].format;
  al_set_new_bitmap_format(uVar1);
  bmp = (ALLEGRO_BITMAP *)al_load_bitmap(this->bmp_filename);
  if (bmp == (ALLEGRO_BITMAP *)0x0) {
    log_printf("Could not load image %s, bitmap format = %d\n",this->bmp_filename,(ulong)uVar1);
    uVar7 = 0x80;
    uVar6 = 0x80;
  }
  else {
    uVar6 = al_get_bitmap_width(bmp);
    uVar7 = al_get_bitmap_height(bmp);
  }
  uVar1 = formats[iVar5].format;
  al_set_new_bitmap_format(uVar1);
  bmp_00 = (ALLEGRO_BITMAP *)al_create_bitmap(uVar6,uVar7);
  if (bmp_00 == (ALLEGRO_BITMAP *)0x0) {
    log_printf("Could not create bitmap, format = %d\n",(ulong)uVar1);
  }
  else if (bmp != (ALLEGRO_BITMAP *)0x0) {
    uVar8 = al_get_target_bitmap();
    al_set_target_bitmap(bmp_00);
    al_map_rgb(0x80,0x80,0x80);
    al_clear_to_color();
    iVar4 = 0;
    al_set_blender(0,1,0);
    if (local_1a0._0_1_ == '\0') {
      al_draw_bitmap(0,0,bmp,0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"",(allocator<char> *)&s);
      Label::set_text(&this->time_label,&local_178);
      this_00 = &local_178;
    }
    else {
      local_1a0 = (double)al_get_time();
      log_printf("Timing...\n");
      do {
        al_draw_bitmap(0,0,bmp,0);
        iVar4 = iVar4 + 1;
        dVar9 = (double)al_get_time();
      } while (dVar9 - local_1a0 < 0.25);
      local_1a0 = dVar9 - local_1a0;
      log_printf("    ...done.\n");
      sprintf((char *)&s,"%.0f FPS",(double)iVar4 / local_1a0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,(char *)&s,&local_1a1)
      ;
      Label::set_text(&this->time_label,&local_158);
      this_00 = &local_158;
    }
    std::__cxx11::string::~string((string *)this_00);
    al_set_target_bitmap(uVar8);
    al_set_blender(0,1,3);
    al_draw_bitmap(0,0,bmp_00,0);
    goto LAB_00108030;
  }
  uVar6 = 0;
  uVar8 = al_map_rgb_f(0x3f800000,0,0);
  al_draw_line(0,0,0x43a00000,0x43480000,uVar8,uVar6,0);
  uVar6 = 0;
  uVar8 = al_map_rgb_f(0x3f800000,0,0);
  al_draw_line(0,0x43480000,0x43a00000,0,uVar8,uVar6,0);
LAB_00108030:
  __s = get_format_name(bmp);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,__s,&local_1a1);
  std::__cxx11::string::append((char *)&s);
  get_format_name(bmp_00);
  std::__cxx11::string::append((char *)&s);
  std::__cxx11::string::string((string *)&local_198,(string *)&s);
  Label::set_text(&this->true_formats,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  al_destroy_bitmap(bmp);
  al_destroy_bitmap(bmp_00);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void Prog::draw_sample()
{
   const int i = source_list.get_cur_value();
   const int j = dest_list.get_cur_value();
   ALLEGRO_BITMAP *bitmap1;
   ALLEGRO_BITMAP *bitmap2;
   bool use_memory = use_memory_button.get_pushed();
   bool enable_timing = enable_timing_button.get_pushed();
   int bmp_w = 128;
   int bmp_h = 128;
   
   if (use_memory)
      al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   else
      al_set_new_bitmap_flags(ALLEGRO_VIDEO_BITMAP);

   al_set_new_bitmap_format(formats[i].format);

   bitmap1 = al_load_bitmap(bmp_filename);
   if (!bitmap1) {
      log_printf("Could not load image %s, bitmap format = %d\n", bmp_filename,
         formats[i].format);
   }
   else {
      bmp_w = al_get_bitmap_width(bitmap1);
      bmp_h = al_get_bitmap_height(bitmap1);
   }

   al_set_new_bitmap_format(formats[j].format);

   bitmap2 = al_create_bitmap(bmp_w, bmp_h);
   if (!bitmap2) {
      log_printf("Could not create bitmap, format = %d\n", formats[j].format);
   }

   if (bitmap1 && bitmap2) {
      ALLEGRO_BITMAP *target = al_get_target_bitmap();

      al_set_target_bitmap(bitmap2);
      al_clear_to_color(al_map_rgb(128, 128, 128));
      al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
      if (enable_timing) {
         double t0, t1;
         char str[256];
         int frames = 0;

         t0 = al_get_time();
         log_printf("Timing...\n");
         do {
           al_draw_bitmap(bitmap1, 0, 0, 0);
           frames++;
           t1 = al_get_time();
         } while (t1 - t0 < 0.25);
         log_printf("    ...done.\n");
         sprintf(str, "%.0f FPS", (double)frames / (t1 - t0));
         time_label.set_text(str);
      }
      else {
         al_draw_bitmap(bitmap1, 0, 0, 0);
         time_label.set_text("");
      }

      al_set_target_bitmap(target);
      al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
      al_draw_bitmap(bitmap2, 0, 0, 0);
   }
   else {
      al_draw_line(0, 0, 320, 200, al_map_rgb_f(1, 0, 0), 0);
      al_draw_line(0, 200, 320, 0, al_map_rgb_f(1, 0, 0), 0);
   }

   std::string s = get_format_name(bitmap1);
   s += " -> ";
   s += get_format_name(bitmap2);
   true_formats.set_text(s);

   al_destroy_bitmap(bitmap1);
   al_destroy_bitmap(bitmap2);
}